

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invert.c
# Opt level: O2

OPJ_BOOL opj_matrix_inversion_f
                   (OPJ_FLOAT32 *pSrcMatrix,OPJ_FLOAT32 *pDestMatrix,OPJ_UINT32 nb_compo)

{
  ulong uVar1;
  uint uVar2;
  uint *__s;
  void *__s_00;
  OPJ_FLOAT32 *pOVar3;
  OPJ_FLOAT32 *pOVar4;
  ulong uVar5;
  float *pfVar6;
  float *pfVar7;
  ulong __n;
  ulong uVar8;
  float *pfVar9;
  uint *puVar10;
  OPJ_BOOL OVar11;
  long lVar12;
  ulong uVar13;
  float *pfVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  float *pfVar18;
  ulong uVar19;
  float fVar20;
  float fVar21;
  long local_90;
  uint *local_88;
  OPJ_FLOAT32 *local_50;
  
  __s = (uint *)opj_malloc((ulong)(nb_compo << 4));
  if (__s == (uint *)0x0) {
    OVar11 = 0;
  }
  else {
    uVar19 = (ulong)nb_compo;
    __n = (ulong)(nb_compo * 4);
    memset(__s,0,__n);
    for (lVar12 = 0; nb_compo != (uint)lVar12; lVar12 = lVar12 + 1) {
      __s[lVar12] = (uint)lVar12;
    }
    __s_00 = (void *)((long)__s + __n);
    uVar15 = 1;
    uVar17 = 0;
    local_90 = 4;
    uVar5 = 0;
    pOVar4 = pSrcMatrix;
    pOVar3 = pSrcMatrix;
    uVar13 = (ulong)(nb_compo - 1);
    local_88 = __s;
    while( true ) {
      uVar16 = (uint)uVar17;
      uVar2 = uVar16;
      if (uVar16 < nb_compo) {
        uVar2 = nb_compo;
      }
      if (uVar17 == nb_compo - 1) {
        pfVar18 = (float *)((long)__s_00 + (ulong)(nb_compo * 2) * 4);
        local_50 = pDestMatrix;
        for (uVar5 = 0; uVar5 != uVar19; uVar5 = uVar5 + 1) {
          memset(__s_00,0,__n);
          *(undefined4 *)((long)__s_00 + uVar5 * 4) = 0x3f800000;
          pOVar4 = pSrcMatrix;
          pfVar6 = pfVar18;
          puVar10 = __s;
          for (uVar15 = 0; pOVar3 = pSrcMatrix + nb_compo * nb_compo,
              pfVar7 = (float *)(pSrcMatrix + ((ulong)(nb_compo * nb_compo) - 1)),
              pfVar9 = pfVar18 + uVar19, uVar13 = uVar19,
              pfVar14 = (float *)((long)__s_00 + uVar19 * 8), uVar15 != nb_compo;
              uVar15 = uVar15 + 1) {
            fVar20 = 0.0;
            for (lVar12 = 0; (int)lVar12 + 1U <= uVar15; lVar12 = lVar12 + 1) {
              fVar20 = fVar20 + (float)pOVar4[lVar12] * pfVar18[lVar12];
            }
            uVar2 = *puVar10;
            puVar10 = puVar10 + 1;
            *pfVar6 = *(float *)((long)__s_00 + (ulong)uVar2 * 4) - fVar20;
            pfVar6 = pfVar6 + 1;
            pOVar4 = pOVar4 + uVar19;
          }
          while ((int)uVar13 != 0) {
            fVar20 = 0.0;
            for (lVar12 = 0; (uint)((int)uVar13 + (int)lVar12) < nb_compo; lVar12 = lVar12 + 1) {
              fVar20 = fVar20 + (float)pOVar3[lVar12] * pfVar14[lVar12];
            }
            pfVar14[-1] = (pfVar9[-1] - fVar20) / *pfVar7;
            pOVar3 = pOVar3 + -(ulong)(nb_compo + 1);
            pfVar7 = pfVar7 + -(ulong)(nb_compo + 1);
            pfVar9 = pfVar9 + -1;
            uVar13 = uVar13 - 1;
            pfVar14 = pfVar14 + -1;
          }
          pOVar4 = local_50;
          for (lVar12 = 0; uVar19 * 4 - lVar12 != 0; lVar12 = lVar12 + 4) {
            *pOVar4 = *(OPJ_FLOAT32 *)((long)__s_00 + lVar12 + uVar19 * 4);
            pOVar4 = pOVar4 + uVar19;
          }
          local_50 = local_50 + 1;
        }
        OVar11 = 1;
        goto LAB_0010dda5;
      }
      pfVar18 = (float *)(pOVar4 + uVar17);
      fVar20 = 0.0;
      pfVar6 = (float *)pOVar3;
      for (uVar8 = uVar17 & 0xffffffff; uVar2 != (OPJ_UINT32)uVar8;
          uVar8 = (ulong)((OPJ_UINT32)uVar8 + 1)) {
        fVar21 = *pfVar6;
        if (fVar21 <= -fVar21) {
          fVar21 = -fVar21;
        }
        uVar1 = uVar8;
        if (fVar21 <= fVar20) {
          fVar21 = fVar20;
          uVar1 = uVar5;
        }
        uVar5 = uVar1;
        fVar20 = fVar21;
        pfVar6 = pfVar6 + uVar19;
      }
      if ((fVar20 == 0.0) && (!NAN(fVar20))) break;
      if (uVar17 != uVar5) {
        uVar2 = *local_88;
        *local_88 = local_88[uVar5 - uVar17];
        local_88[uVar5 - uVar17] = uVar2;
        memcpy(__s_00,pOVar4 + ((int)uVar5 - uVar16) * nb_compo,__n);
        memcpy(pOVar4 + ((int)uVar5 - uVar16) * nb_compo,pOVar4,__n);
        memcpy(pOVar4,__s_00,__n);
      }
      fVar20 = *pfVar18;
      pfVar6 = pfVar18 + uVar19;
      pfVar18 = pfVar18 + 1;
      for (uVar2 = uVar15; uVar2 < nb_compo; uVar2 = uVar2 + 1) {
        fVar21 = *pfVar6;
        *pfVar6 = fVar21 / fVar20;
        pfVar7 = (float *)((long)pfVar6 + local_90);
        pfVar9 = pfVar18 + -uVar13;
        for (lVar12 = 1; uVar16 + (int)lVar12 < nb_compo; lVar12 = lVar12 + 1) {
          pfVar6[lVar12] = pfVar18[lVar12 + -1] * -(fVar21 / fVar20) + pfVar6[lVar12];
          pfVar7 = pfVar7 + 1;
          pfVar9 = pfVar9 + 1;
        }
        pfVar6 = pfVar7;
        pfVar18 = pfVar9;
      }
      uVar15 = uVar15 + 1;
      uVar13 = (ulong)((int)uVar13 - 1);
      pOVar4 = pOVar4 + uVar19;
      local_88 = local_88 + 1;
      uVar17 = uVar17 + 1;
      pOVar3 = (OPJ_FLOAT32 *)((float *)pOVar3 + uVar19 + 1);
      local_90 = local_90 + 4;
    }
    OVar11 = 0;
LAB_0010dda5:
    opj_free(__s);
  }
  return OVar11;
}

Assistant:

OPJ_BOOL opj_matrix_inversion_f(OPJ_FLOAT32 * pSrcMatrix,
                                OPJ_FLOAT32 * pDestMatrix,
                                OPJ_UINT32 nb_compo)
{
    OPJ_BYTE * l_data = 00;
    OPJ_UINT32 l_permutation_size = nb_compo * (OPJ_UINT32)sizeof(OPJ_UINT32);
    OPJ_UINT32 l_swap_size = nb_compo * (OPJ_UINT32)sizeof(OPJ_FLOAT32);
    OPJ_UINT32 l_total_size = l_permutation_size + 3 * l_swap_size;
    OPJ_UINT32 * lPermutations = 00;
    OPJ_FLOAT32 * l_double_data = 00;

    l_data = (OPJ_BYTE *) opj_malloc(l_total_size);
    if (l_data == 0) {
        return OPJ_FALSE;
    }
    lPermutations = (OPJ_UINT32 *) l_data;
    l_double_data = (OPJ_FLOAT32 *)(l_data + l_permutation_size);
    memset(lPermutations, 0, l_permutation_size);

    if (! opj_lupDecompose(pSrcMatrix, lPermutations, l_double_data, nb_compo)) {
        opj_free(l_data);
        return OPJ_FALSE;
    }

    opj_lupInvert(pSrcMatrix, pDestMatrix, nb_compo, lPermutations, l_double_data,
                  l_double_data + nb_compo, l_double_data + 2 * nb_compo);
    opj_free(l_data);

    return OPJ_TRUE;
}